

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivision_geometry_device.cpp
# Opt level: O0

Vec3fa embree::renderPixelStandard(float x,float y,ISPCCamera *camera,RayStats *stats)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  int *in_RDX;
  float *in_RSI;
  ulong *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float in_XMM1_Da;
  ulong extraout_XMM1_Qa;
  ulong uVar12;
  Vec3fa VVar13;
  Ray shadow;
  Vec3fa lightDir;
  uint geomID;
  Vec3fa dPdv;
  Vec3fa dPdu;
  Vec3fa Ng;
  Vec3fa diffuse;
  Ray ray;
  Vec3fa *color;
  RTCInterpolateArguments args;
  vfloat4 b1;
  vfloat4 a1;
  vfloat4 b0;
  vfloat4 a0;
  vint4 mask_4;
  vint4 mask_3;
  vint4 mask_1;
  vint4 mask;
  __m128 c_2;
  __m128 r_1;
  __m128 a_2;
  __m128 c_4;
  __m128 r_2;
  __m128 a_4;
  __m128 c;
  __m128 r;
  __m128 a;
  __m128 mask_2;
  vfloat4 c_5;
  vfloat4 b_2;
  vfloat4 a_5;
  vfloat4 c_3;
  vfloat4 b_1;
  vfloat4 a_3;
  vfloat4 c_1;
  vfloat4 b;
  vfloat4 a_1;
  float local_2538;
  float local_2534;
  undefined1 local_2498 [8];
  ulong uStack_2490;
  undefined8 local_2488;
  undefined8 uStack_2480;
  undefined8 local_2478;
  ulong uStack_2470;
  undefined8 local_2468;
  ulong uStack_2460;
  undefined8 local_2458;
  ulong uStack_2450;
  undefined1 local_2448 [8];
  ulong uStack_2440;
  float local_2438;
  undefined4 local_2434;
  undefined1 auStack_2428 [20];
  undefined4 local_2414;
  undefined4 local_2410;
  undefined4 local_240c;
  undefined4 local_2408;
  undefined8 local_23f8;
  undefined8 uStack_23f0;
  float local_23e8;
  float fStack_23e4;
  ulong uStack_23e0;
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  ulong local_23c8;
  ulong uStack_23c0;
  undefined8 local_23b8;
  ulong uStack_23b0;
  int local_239c;
  undefined8 local_2398;
  undefined8 uStack_2390;
  undefined8 local_2388;
  undefined8 uStack_2380;
  undefined8 local_2378;
  ulong uStack_2370;
  undefined8 local_2368;
  undefined8 uStack_2360;
  float local_2354 [3];
  float local_2348 [3];
  float local_233c [3];
  float local_2330 [3];
  float local_2324 [3];
  undefined8 local_2318;
  ulong uStack_2310;
  undefined8 local_2308;
  ulong uStack_2300;
  undefined8 local_22f8;
  ulong uStack_22f0;
  undefined8 local_22e8;
  ulong uStack_22e0;
  float local_22d8;
  undefined4 local_22d4;
  undefined4 local_22c8;
  undefined4 local_22c4;
  uint local_22c0;
  undefined4 local_22bc;
  undefined4 local_22b8;
  undefined4 local_22b4;
  int local_22b0;
  undefined4 local_22ac;
  undefined4 local_22a8;
  int *local_2290;
  undefined1 local_2280 [4];
  undefined1 local_227c [12];
  undefined8 *local_2270;
  undefined8 *local_2268;
  undefined1 *local_2260;
  undefined1 *local_2258;
  float *local_2250;
  undefined8 *local_2248;
  float *local_2240;
  undefined8 *local_2238;
  undefined4 *local_2230;
  undefined8 *local_2228;
  float local_221c;
  float *local_2218;
  float *local_2210;
  float local_2204;
  float local_2200;
  float local_21fc;
  float *local_21f8;
  float *local_21f0;
  float *local_21e8;
  float local_21dc;
  float local_21d8;
  float local_21d4;
  float *local_21d0;
  float *local_21c8;
  float *local_21c0;
  float local_21b4;
  float local_21b0;
  float local_21ac;
  float *local_21a8;
  undefined1 *local_21a0;
  float *local_2198;
  float local_218c;
  float local_2188;
  float local_2184 [3];
  undefined1 *local_2178;
  float *local_2170;
  undefined4 local_2168;
  undefined4 local_2164;
  undefined4 local_2160;
  undefined4 local_215c;
  float local_2158;
  undefined4 local_2154;
  undefined8 *local_2150;
  undefined8 *local_2148;
  undefined8 *local_2140;
  undefined4 local_2138;
  undefined4 local_2134;
  undefined4 local_2130;
  undefined4 local_212c;
  float local_2128;
  undefined4 local_2124;
  undefined1 *local_2120;
  undefined8 *local_2118;
  undefined8 *local_2110;
  undefined8 *local_2108;
  int *local_2100;
  undefined4 local_20f4;
  undefined4 local_20e4;
  undefined4 local_20e0;
  undefined4 local_20dc;
  undefined8 *local_20d8;
  undefined4 local_20cc;
  undefined4 local_20c8;
  undefined4 local_20c4;
  undefined8 *local_20c0;
  undefined4 local_20b4;
  undefined4 local_20b0;
  undefined4 local_20ac;
  undefined8 *local_20a8;
  undefined8 local_20a0;
  undefined4 local_2098;
  undefined4 local_2094;
  undefined4 local_2090;
  undefined4 local_208c;
  undefined4 local_2088;
  undefined8 local_2080;
  undefined8 *local_2078;
  undefined8 *local_2070;
  undefined8 local_2068;
  undefined8 local_2060;
  undefined8 local_2058;
  undefined4 local_2050;
  undefined4 local_2044;
  undefined8 *local_2040;
  undefined8 *local_2038;
  undefined8 local_2030;
  undefined4 local_2024;
  undefined4 local_2020;
  undefined4 local_201c;
  undefined4 local_2018;
  undefined4 local_2014;
  undefined8 local_2010;
  undefined8 local_2008;
  undefined8 uStack_2000;
  undefined8 local_1ff8;
  undefined8 uStack_1ff0;
  undefined8 local_1fe8;
  ulong uStack_1fe0;
  undefined1 local_1fd8 [16];
  undefined1 local_1fc8 [16];
  undefined8 local_1fb8;
  undefined8 uStack_1fb0;
  undefined1 local_1fa8 [16];
  undefined8 local_1f98;
  undefined8 uStack_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 *local_1f70;
  undefined8 *local_1f68;
  undefined8 *local_1f60;
  ulong *local_1f48;
  undefined8 *local_1f38;
  undefined8 *local_1f30;
  undefined8 *local_1f10;
  ulong *local_1f00;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  undefined4 local_1e9c;
  undefined8 *local_1e98;
  undefined8 *local_1e90;
  undefined4 local_1e84;
  undefined8 *local_1e80;
  undefined8 *local_1e28;
  float *local_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  float local_1e04;
  undefined8 *local_1e00;
  float *local_1df8;
  float local_1dec;
  undefined8 *local_1de8;
  undefined8 *local_1de0;
  undefined8 *local_1dd8;
  undefined8 *local_1dd0;
  undefined1 local_1dc8 [16];
  undefined8 *local_1db8;
  float local_1dac;
  undefined8 *local_1da8;
  undefined8 *local_1da0;
  undefined8 *local_1d98;
  float *local_1d90;
  undefined1 *local_1d88;
  undefined8 *local_1d80;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 *local_1d48;
  undefined8 *local_1d40;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined4 local_1ce8;
  undefined4 local_1ce4;
  undefined4 local_1ce0;
  undefined4 local_1cdc;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined4 local_1cc8;
  undefined4 local_1cc4;
  undefined4 local_1cc0;
  undefined4 local_1cbc;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined4 local_1ca8;
  undefined4 local_1ca4;
  undefined4 local_1ca0;
  undefined4 local_1c9c;
  ulong uStack_1c90;
  undefined4 local_1c7c;
  undefined8 local_1c78;
  ulong uStack_1c70;
  float local_1c68;
  undefined4 local_1c5c;
  undefined8 local_1c58;
  ulong uStack_1c50;
  float local_1c48;
  float local_1c44;
  float local_1c40;
  undefined4 local_1c3c;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined1 local_1c28 [8];
  ulong uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined1 local_1c08 [8];
  ulong uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined4 local_1bdc;
  undefined1 *local_1bd8;
  undefined1 *local_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1bb8;
  ulong uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  ulong uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined4 local_1b6c;
  undefined8 *local_1b68;
  undefined8 *local_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  ulong uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  ulong uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined4 local_1afc;
  undefined8 *local_1af8;
  undefined8 *local_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  ulong uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  ulong uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined4 local_1a8c;
  undefined8 *local_1a88;
  undefined8 *local_1a80;
  undefined1 *local_1a78;
  undefined4 *local_1a70;
  undefined4 local_1a68;
  undefined4 local_1a64;
  undefined4 local_1a60;
  undefined4 local_1a5c;
  undefined8 *local_1a58;
  undefined4 local_1a50;
  undefined4 local_1a4c;
  undefined4 local_1a48;
  undefined4 local_1a44;
  undefined8 *local_1a40;
  undefined4 local_1a38;
  undefined4 local_1a34;
  undefined4 local_1a30;
  undefined4 local_1a2c;
  undefined8 *local_1a28;
  undefined4 local_1a20;
  undefined4 local_1a1c;
  undefined4 local_1a18;
  undefined4 local_1a14;
  undefined8 *local_1a10;
  undefined8 *local_1a08;
  undefined8 *local_1a00;
  undefined8 *local_19f8;
  undefined8 *local_19f0;
  undefined8 *local_19e8;
  undefined8 *local_19e0;
  undefined8 *local_19d8;
  undefined8 *local_19d0;
  undefined8 *local_19c8;
  undefined8 *local_19c0;
  undefined8 *local_19b8;
  undefined8 *local_19b0;
  undefined8 *local_19a8;
  undefined1 *local_19a0;
  undefined8 *local_1998;
  undefined1 *local_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 *local_1948;
  undefined8 *local_1940;
  undefined8 *local_1938;
  undefined8 *local_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 *local_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 *local_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 *local_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 *local_18b0;
  ulong uStack_18a0;
  undefined1 *local_1890;
  undefined8 local_1888;
  ulong uStack_1880;
  undefined8 *local_1870;
  undefined8 local_1868;
  ulong uStack_1860;
  undefined8 *local_1850;
  undefined8 local_1848;
  ulong uStack_1840;
  undefined8 *local_1830;
  undefined8 local_1828;
  ulong uStack_1820;
  undefined8 *local_1810;
  undefined8 local_1808;
  ulong uStack_1800;
  undefined8 *local_17f0;
  undefined8 local_17e8;
  ulong uStack_17e0;
  undefined8 *local_17d0;
  ulong uStack_17c0;
  undefined1 *local_17b0;
  undefined1 *local_1790;
  undefined1 *local_1770;
  undefined1 *local_1750;
  undefined8 *local_1738;
  undefined4 local_172c;
  undefined8 *local_1728;
  undefined4 local_171c;
  undefined8 *local_1718;
  undefined4 local_170c;
  undefined8 *local_1708;
  undefined4 local_16fc;
  undefined8 *local_16f8;
  undefined8 *local_16f0;
  undefined8 *local_16e8;
  undefined8 *local_16e0;
  undefined1 *local_16d8;
  undefined8 *local_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined4 local_16b0;
  undefined4 local_16ac;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined4 local_1698;
  undefined4 local_1694;
  undefined4 local_1690;
  undefined4 local_168c;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined4 local_1678;
  undefined4 local_1674;
  undefined4 local_1670;
  undefined4 local_166c;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined4 local_1658;
  undefined4 local_1654;
  undefined4 local_1650;
  undefined4 local_164c;
  undefined4 local_1648;
  undefined4 uStack_1644;
  undefined4 uStack_1640;
  undefined4 uStack_163c;
  ulong uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  ulong uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  ulong uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  ulong uStack_15d0;
  ulong uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  ulong uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  ulong uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  ulong uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 *local_1548;
  undefined8 *local_1540;
  undefined8 *local_1538;
  undefined8 *local_1530;
  undefined8 *local_1528;
  undefined8 *local_1520;
  undefined8 *local_1518;
  undefined8 *local_1510;
  undefined8 *local_1508;
  undefined1 *local_1500;
  undefined8 *local_14f8;
  undefined8 *local_14f0;
  undefined8 *local_14e8;
  undefined8 *local_14e0;
  undefined8 *local_14d8;
  undefined8 *local_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined4 local_1448;
  undefined4 uStack_1444;
  undefined4 uStack_1440;
  undefined4 uStack_143c;
  undefined4 local_142c;
  undefined4 local_1428;
  undefined4 uStack_1424;
  undefined4 uStack_1420;
  undefined4 uStack_141c;
  undefined4 local_140c;
  undefined4 local_1408;
  undefined4 uStack_1404;
  undefined4 uStack_1400;
  undefined4 uStack_13fc;
  undefined4 local_13ec;
  undefined4 local_13e8;
  undefined4 uStack_13e4;
  undefined4 uStack_13e0;
  undefined4 uStack_13dc;
  undefined4 local_13cc;
  float local_13c8;
  float fStack_13c4;
  float fStack_13c0;
  float fStack_13bc;
  float local_13ac;
  undefined4 local_1388;
  undefined4 uStack_1384;
  undefined4 uStack_1380;
  undefined4 uStack_137c;
  undefined4 local_136c;
  undefined4 local_1348;
  undefined4 uStack_1344;
  undefined4 uStack_1340;
  undefined4 uStack_133c;
  undefined4 local_1338;
  undefined8 *local_1328;
  undefined8 *local_1320;
  undefined1 local_1318 [16];
  undefined8 local_1308;
  ulong uStack_1300;
  undefined8 *local_12f8;
  undefined8 *local_12f0;
  undefined1 *local_12e8;
  undefined8 *local_12e0;
  undefined1 local_12d8 [16];
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 *local_12b8;
  undefined1 *local_12b0;
  undefined1 *local_12a8;
  undefined8 *local_12a0;
  undefined1 local_1298 [16];
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 *local_1278;
  undefined1 *local_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 *local_1250;
  undefined8 *local_1248;
  undefined8 *local_1240;
  undefined8 *local_1238;
  undefined8 *local_1230;
  undefined8 *local_1228;
  undefined8 *local_1220;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  undefined8 *local_1208;
  undefined8 *local_1200;
  undefined8 *local_11f8;
  undefined1 *local_11f0;
  undefined8 *local_11e8;
  undefined8 *local_11e0;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  undefined8 *local_11c0;
  undefined1 *local_11b8;
  undefined8 *local_11b0;
  undefined8 local_11a8;
  ulong uStack_11a0;
  undefined8 *local_1190;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  ulong *local_1170;
  undefined8 local_1148;
  ulong uStack_1140;
  undefined8 *local_1130;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 *local_10f0;
  undefined8 *local_10e8;
  undefined8 *local_10e0;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined8 *local_10c0;
  undefined8 *local_10b8;
  undefined8 *local_10b0;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined8 local_1098;
  undefined8 uStack_1090;
  float fStack_1084;
  float fStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_f90;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  undefined8 *local_f20;
  undefined8 *local_f18;
  undefined8 *local_f10;
  undefined4 local_f08;
  undefined4 uStack_f04;
  undefined4 uStack_f00;
  undefined4 uStack_efc;
  undefined8 *local_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 *local_ec0;
  undefined8 *local_eb8;
  float *local_eb0;
  float local_ea8;
  float fStack_ea4;
  float fStack_ea0;
  float fStack_e9c;
  float *local_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 *local_e00;
  undefined8 *local_df8;
  undefined8 *local_df0;
  float local_de8;
  float fStack_de4;
  float fStack_de0;
  float fStack_ddc;
  undefined8 *local_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  float local_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  ulong local_d48;
  undefined8 uStack_d40;
  undefined1 local_d38 [16];
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined4 local_d0c;
  ulong local_cc8;
  undefined8 uStack_cc0;
  undefined1 local_cb8 [16];
  ulong local_ca8;
  undefined8 uStack_ca0;
  float local_c8c;
  undefined1 local_c88 [16];
  undefined4 local_c6c;
  undefined1 local_c68 [16];
  undefined4 local_c4c;
  undefined1 local_c48 [16];
  float local_c2c;
  undefined1 local_bc8 [16];
  undefined4 local_bac;
  undefined1 local_ba8 [16];
  undefined4 local_b8c;
  undefined1 local_b88 [16];
  undefined4 local_b6c;
  ulong local_b68;
  undefined8 uStack_b60;
  undefined8 local_b48;
  undefined8 uStack_b40;
  ulong local_b38;
  undefined8 uStack_b30;
  ulong local_b28;
  undefined8 uStack_b20;
  ulong local_af8;
  undefined8 uStack_af0;
  ulong local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  ulong local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  ulong local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  ulong local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  ulong local_a48;
  undefined8 uStack_a40;
  float local_9b8;
  undefined8 local_998;
  undefined8 uStack_990;
  ulong local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  ulong local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  ulong local_908;
  undefined8 uStack_900;
  ulong local_8f8;
  undefined8 uStack_8f0;
  ulong local_8d8;
  undefined8 uStack_8d0;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  undefined1 *local_8a8;
  undefined8 *local_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  undefined8 *local_860;
  float local_854;
  undefined1 *local_850;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_82c;
  undefined8 local_828;
  undefined8 uStack_820;
  float *local_818;
  undefined1 *local_810;
  undefined8 local_808;
  undefined8 uStack_800;
  float local_7f8;
  float fStack_7f4;
  ulong uStack_7f0;
  undefined1 *local_7e8;
  undefined4 local_7dc;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  float local_7a8;
  float fStack_7a4;
  ulong uStack_7a0;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 *local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined4 local_568;
  undefined4 uStack_564;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined4 local_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float *local_98;
  float *local_90;
  float *local_88;
  float *local_80;
  float local_74;
  float local_70;
  float local_6c;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_2250 = in_RSI + 9;
  local_1c40 = in_RSI[0xb];
  local_1c48 = *local_2250;
  local_1c44 = in_RSI[10];
  local_1c58 = *(undefined8 *)local_2250;
  local_1c3c = 0;
  uStack_1c50 = (ulong)(uint)local_1c40;
  local_21c8 = local_2348;
  local_2178 = local_227c;
  local_2184[0] = in_XMM0_Da * *in_RSI;
  local_e8 = local_2184;
  local_f0 = &local_2188;
  local_f8 = &local_218c;
  local_21a8 = in_RSI + 3;
  local_21d0 = local_2354;
  local_21a0 = local_2280;
  local_21ac = in_XMM1_Da * *local_21a8;
  local_c8 = &local_21ac;
  local_d0 = &local_21b0;
  local_d8 = &local_21b4;
  local_21f0 = local_233c;
  local_21d4 = local_2184[0] + local_21ac;
  local_a8 = &local_21d4;
  local_b0 = &local_21d8;
  local_b8 = &local_21dc;
  local_21f8 = in_RSI + 6;
  local_2218 = local_2330;
  local_21fc = local_21d4 + *local_21f8;
  local_88 = &local_21fc;
  local_90 = &local_2200;
  local_98 = &local_2204;
  local_2240 = local_2324;
  local_c = local_2204 * local_2204;
  local_18 = local_2200 * local_2200 + local_c;
  local_c8c = local_21fc * local_21fc + local_18;
  local_c48._4_4_ = 0;
  local_c48._0_4_ = local_c8c;
  local_ca8 = local_c48._0_8_;
  uStack_ca0 = 0;
  local_b68 = local_c48._0_8_;
  uStack_b60 = 0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_c48._0_8_;
  local_cb8 = rsqrtss(auVar11,auVar11);
  local_c4c = 0x3fc00000;
  local_c68 = ZEXT416(0x3fc00000);
  local_a58 = local_cb8._0_8_;
  uVar4 = local_a58;
  uStack_a50 = local_cb8._8_8_;
  local_a58._0_4_ = local_cb8._0_4_;
  local_a48 = (ulong)(uint)((float)local_a58 * 1.5);
  uStack_a40 = 0;
  local_c6c = 0xbf000000;
  local_c88 = ZEXT416(0xbf000000);
  local_a78 = local_c88._0_8_;
  uStack_a70 = 0;
  local_a68 = (ulong)(uint)(local_c8c * -0.5);
  uStack_a60 = 0;
  local_a98 = local_cb8._0_8_;
  uStack_a90 = local_cb8._8_8_;
  local_221c = local_c8c * -0.5 * (float)local_a58;
  local_a88 = (ulong)(uint)local_221c;
  uStack_a80 = 0;
  local_ab8 = local_cb8._0_8_;
  uStack_ab0 = local_cb8._8_8_;
  local_aa8 = CONCAT44(local_cb8._4_4_,(float)local_a58 * (float)local_a58);
  uStack_aa0 = local_cb8._8_8_;
  local_ad8 = local_aa8;
  uStack_ad0 = local_cb8._8_8_;
  local_221c = local_221c * (float)local_a58 * (float)local_a58;
  local_ac8 = (ulong)(uint)local_221c;
  uStack_ac0 = 0;
  local_b38 = local_ac8;
  uStack_b30 = 0;
  local_221c = (float)local_a58 * 1.5 + local_221c;
  local_b28 = (ulong)(uint)local_221c;
  uStack_b20 = 0;
  local_cc8 = local_b28;
  uStack_cc0 = 0;
  local_8f8 = local_b28;
  uStack_8f0 = 0;
  local_68 = &local_221c;
  local_1c68 = local_21fc * local_221c;
  fVar5 = local_2200 * local_221c;
  fVar6 = local_2204 * local_221c;
  local_40 = &local_6c;
  local_48 = &local_70;
  local_50 = &local_74;
  local_1c78 = CONCAT44(local_70,local_1c68);
  local_1c5c = 0;
  uStack_1c70 = (ulong)(uint)local_74;
  local_2258 = &inf;
  local_2290 = in_RDX;
  local_2248 = &local_2308;
  local_2238 = &local_2318;
  local_2210 = local_2240;
  local_2204 = local_21dc + in_RSI[8];
  local_2200 = local_21d8 + in_RSI[7];
  local_21e8 = local_2218;
  local_21dc = local_218c + local_21b4;
  local_21d8 = local_2188 + local_21b0;
  local_21c0 = local_21f0;
  local_21b4 = in_XMM1_Da * in_RSI[5];
  local_21b0 = in_XMM1_Da * in_RSI[4];
  local_2198 = local_21d0;
  local_218c = in_XMM0_Da * in_RSI[2];
  local_2188 = in_XMM0_Da * in_RSI[1];
  local_2170 = local_21c8;
  local_c48 = ZEXT416((uint)local_c8c);
  local_c2c = local_c8c;
  local_a58 = uVar4;
  local_e0 = local_21c8;
  local_c0 = local_21d0;
  local_a0 = local_21f0;
  local_80 = local_2218;
  local_74 = fVar6;
  local_70 = fVar5;
  local_6c = local_1c68;
  local_60 = local_2218;
  local_58 = local_2240;
  local_38 = local_2240;
  local_30 = local_2218;
  local_28 = local_2218;
  local_20 = local_2218;
  local_14 = local_21fc;
  local_10 = local_21fc;
  local_2354[0] = local_21ac;
  local_2348[0] = local_2184[0];
  local_233c[0] = local_21d4;
  local_2330[0] = local_21fc;
  local_2324[0] = local_1c68;
  local_2318 = local_1c78;
  uStack_2310 = uStack_1c70;
  local_2308 = local_1c58;
  uStack_2300 = uStack_1c50;
  local_22d8 = std::numeric_limits<float>::infinity();
  local_2140 = &local_22f8;
  local_2154 = 0;
  local_215c = 0;
  local_2160 = 0xffffffff;
  local_2164 = 0xffffffff;
  local_2168 = 0xffffffff;
  local_1a8c = 0;
  local_1a58 = &local_1aa8;
  local_1a5c = 0xffffffff;
  local_1a60 = 0xffffffff;
  local_1a64 = 0xffffffff;
  local_1a68 = 0;
  local_164c = 0;
  local_1650 = 0xffffffff;
  local_1654 = 0xffffffff;
  local_1658 = 0xffffffff;
  local_1668 = 0xffffffffffffffff;
  uStack_1660 = 0xffffffff;
  local_1aa8 = 0xffffffffffffffff;
  uStack_1aa0 = 0xffffffff;
  local_1988 = 0xffffffffffffffff;
  uStack_1980 = 0xffffffff;
  local_19f8 = &local_1ac8;
  local_1ac8 = 0xffffffffffffffff;
  uStack_1ac0 = 0xffffffff;
  local_1848 = local_2308;
  uStack_1820 = uStack_2300;
  local_1a00 = &local_1ad8;
  local_1a08 = &local_1ae8;
  local_172c = 0;
  local_13cc = 0;
  local_13e8 = 0;
  uStack_13e4 = 0;
  uStack_13e0 = 0;
  uStack_13dc = 0;
  local_1468 = 0;
  uStack_1460 = 0;
  local_19f0 = &local_1ab8;
  local_1558 = 0xffffffffffffffff;
  uStack_1550 = 0xffffffff;
  uStack_1840 = uStack_2300 & 0xffffffff;
  local_1458 = 0xffffffffffffffff;
  uStack_1450 = 0xffffffff;
  local_15e8 = 0;
  uStack_15e0 = 0;
  local_1af0 = &local_22e8;
  local_1afc = 0;
  local_1a40 = &local_1b18;
  local_1a44 = 0xffffffff;
  local_1a48 = 0xffffffff;
  local_1a4c = 0xffffffff;
  local_1a50 = 0;
  local_166c = 0;
  local_1670 = 0xffffffff;
  local_1674 = 0xffffffff;
  local_1678 = 0xffffffff;
  local_1688 = 0xffffffffffffffff;
  uStack_1680 = 0xffffffff;
  local_1b18 = 0xffffffffffffffff;
  uStack_1b10 = 0xffffffff;
  local_1978 = 0xffffffffffffffff;
  uStack_1970 = 0xffffffff;
  local_19d8 = &local_1b38;
  local_1b38 = 0xffffffffffffffff;
  uStack_1b30 = 0xffffffff;
  local_1868 = local_2318;
  uStack_1800 = uStack_2310;
  local_19e0 = &local_1b48;
  local_19e8 = &local_1b58;
  local_171c = 0;
  local_13ec = 0;
  local_1408 = 0;
  uStack_1404 = 0;
  uStack_1400 = 0;
  uStack_13fc = 0;
  local_1488 = 0;
  uStack_1480 = 0;
  local_19d0 = &local_1b28;
  local_1578 = 0xffffffffffffffff;
  uStack_1570 = 0xffffffff;
  uStack_1860 = uStack_2310 & 0xffffffff;
  local_1478 = 0xffffffffffffffff;
  uStack_1470 = 0xffffffff;
  local_1608 = 0;
  uStack_1600 = 0;
  local_22d4 = 0xffffffff;
  local_1a70 = &local_22c8;
  local_22b4 = 0xffffffff;
  local_22b0 = -1;
  local_22ac = 0xffffffff;
  local_22a8 = 0xffffffff;
  local_2158 = local_22d8;
  local_2150 = &local_2318;
  local_2148 = &local_2308;
  local_2108 = local_2140;
  local_1af8 = &local_2318;
  local_1a88 = &local_2308;
  local_1a80 = local_2140;
  local_1948 = local_1a58;
  local_1940 = local_1a40;
  local_1928 = local_1988;
  uStack_1920 = uStack_1980;
  local_1910 = local_19f8;
  local_1908 = local_1978;
  uStack_1900 = uStack_1970;
  local_18f0 = local_19d8;
  local_1850 = local_19d0;
  local_1830 = local_19f0;
  local_1828 = local_1848;
  local_1810 = local_1a00;
  local_1808 = local_1868;
  local_17f0 = local_19e0;
  local_1728 = local_1a08;
  local_1718 = local_19e8;
  local_16f0 = local_19f0;
  local_16e8 = local_19d0;
  local_15f8 = local_1868;
  uStack_15f0 = uStack_1860;
  local_15d8 = local_1848;
  uStack_15d0 = uStack_1840;
  local_1588 = local_1868;
  uStack_1580 = uStack_1800;
  local_1568 = local_1848;
  uStack_1560 = uStack_1820;
  local_1528 = local_19d8;
  local_1520 = local_19d8;
  local_1518 = local_19f8;
  local_1510 = local_19f8;
  local_14e8 = local_19e8;
  local_14e0 = local_19e0;
  local_14d8 = local_1a08;
  local_14d0 = local_1a00;
  local_22f8 = local_1848;
  uStack_22f0 = uStack_1840;
  local_22e8 = local_1868;
  uStack_22e0 = uStack_1860;
  local_1b58 = local_1488;
  uStack_1b50 = uStack_1480;
  local_1b48 = local_1868;
  uStack_1b40 = uStack_1800;
  local_1b28 = local_1868;
  uStack_1b20 = uStack_1860;
  local_1ae8 = local_1468;
  uStack_1ae0 = uStack_1460;
  local_1ad8 = local_1848;
  uStack_1ad0 = uStack_1820;
  local_1ab8 = local_1848;
  uStack_1ab0 = uStack_1840;
  rtcIntersect1(g_scene,local_2140,0);
  local_2100 = local_2290;
  *local_2290 = *local_2290 + 1;
  local_20f4 = 0;
  local_1338 = 0;
  local_1348 = 0;
  uStack_1344 = 0;
  uStack_1340 = 0;
  uStack_133c = 0;
  uVar7 = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  uVar12 = extraout_XMM1_Qa;
  if (local_22b0 != -1) {
    if (local_22b0 == 0) {
      local_20c0 = &local_2368;
      local_20c4 = 0x3f4ccccd;
      local_20c8 = 0;
      local_20cc = 0;
      local_1cbc = 0;
      local_1cc0 = 0;
      local_1cc4 = 0;
      local_1cc8 = 0x3f4ccccd;
      local_1cd8 = 0x3f4ccccd;
      uStack_1cd0 = 0;
      local_2368 = 0x3f4ccccd;
      uStack_2360 = 0;
    }
    else {
      local_20d8 = &local_2368;
      local_20dc = 0x3f666666;
      local_20e0 = 0x3f19999a;
      local_20e4 = 0x3f000000;
      local_1c9c = 0;
      local_1ca0 = 0x3f000000;
      local_1ca4 = 0x3f19999a;
      local_1ca8 = 0x3f666666;
      local_1cb8 = 0x3f19999a3f666666;
      uStack_1cb0 = 0x3f000000;
      local_2368 = 0x3f19999a3f666666;
      uStack_2360 = 0x3f000000;
    }
    local_2230 = &local_22c8;
    local_2228 = &local_2378;
    local_2378 = CONCAT44(local_22c4,local_22c8);
    local_1c7c = 0;
    uStack_1c90 = (ulong)local_22c0;
    uStack_2370 = uStack_1c90;
    if (local_22b0 != 0) {
      local_239c = local_22b0;
      local_2270 = &local_2388;
      local_2268 = &local_2398;
      local_20a0 = rtcGetGeometry(g_scene,local_22b0);
      local_2014 = local_22b4;
      local_2018 = local_22bc;
      local_201c = local_22b8;
      local_2020 = 1;
      local_2024 = 0;
      local_2030 = 0;
      local_2044 = 3;
      local_2098 = local_22b4;
      local_2094 = local_22bc;
      local_2090 = local_22b8;
      local_208c = 1;
      local_2088 = 0;
      local_2080 = 0;
      local_2068 = 0;
      local_2060 = 0;
      local_2058 = 0;
      local_2050 = 3;
      local_2078 = &local_2388;
      local_2070 = &local_2398;
      local_2040 = &local_2398;
      local_2038 = &local_2388;
      local_2010 = local_20a0;
      rtcInterpolate(&local_20a0);
      local_1f60 = &local_23b8;
      local_1738 = &local_1f88;
      local_1f88 = local_2388;
      uStack_1f80 = uStack_2380;
      auVar2._8_8_ = uStack_2390;
      auVar2._0_8_ = local_2398;
      local_1750 = local_1fa8;
      local_12a0 = &local_1f98;
      fStack_1210 = (float)local_2398;
      auVar8._12_4_ = (float)((ulong)uStack_2390 >> 0x20);
      auVar8._0_8_ = auVar2._4_8_;
      auVar8._8_4_ = fStack_1210;
      local_1298._8_8_ = auVar8._8_8_;
      uStack_1280 = local_1298._8_8_;
      uStack_1f90 = local_1298._8_8_;
      auVar3._8_8_ = uStack_2380;
      auVar3._0_8_ = local_2388;
      local_1770 = local_1fc8;
      local_12e0 = &local_1fb8;
      local_1218 = (float)local_2388;
      auVar9._12_4_ = (float)((ulong)uStack_2380 >> 0x20);
      auVar9._0_8_ = auVar3._4_8_;
      auVar9._8_4_ = local_1218;
      local_12d8._8_8_ = auVar9._8_8_;
      uStack_12c0 = local_12d8._8_8_;
      uStack_1fb0 = local_12d8._8_8_;
      local_1790 = local_1fd8;
      local_1250 = &local_2008;
      uStack_1070 = local_12d8._8_8_;
      local_1078._0_4_ = (float)((ulong)local_2388 >> 0x20);
      local_1078._4_4_ = (float)uStack_2380;
      fStack_1084 = (float)((ulong)local_2398 >> 0x20);
      fStack_1080 = (float)uStack_2390;
      local_11d8 = (float)local_1078 * fStack_1210;
      fStack_11d4 = local_1078._4_4_ * fStack_1084;
      fStack_11d0 = local_1218 * fStack_1080;
      fStack_11cc = auVar9._12_4_ * auVar8._12_4_;
      local_1328 = &local_1ff8;
      local_1220 = &local_1268;
      uStack_1060 = local_1298._8_8_;
      local_1218 = local_1218 * fStack_1084;
      fStack_1214 = (float)local_1078 * fStack_1080;
      fStack_1210 = local_1078._4_4_ * fStack_1210;
      fStack_120c = auVar9._12_4_ * auVar8._12_4_;
      local_1098 = CONCAT44(fStack_1214,local_1218);
      uStack_1090 = CONCAT44(fStack_120c,fStack_1210);
      local_10a8 = (float)local_2008;
      fStack_10a4 = (float)((ulong)local_2008 >> 0x20);
      fStack_10a0 = (float)uStack_2000;
      fStack_109c = (float)((ulong)uStack_2000 >> 0x20);
      local_10d8 = local_1218 - local_10a8;
      fStack_10d4 = fStack_1214 - fStack_10a4;
      fStack_10d0 = fStack_1210 - fStack_10a0;
      auVar10._12_4_ = fStack_120c - fStack_109c;
      local_1108 = CONCAT44(fStack_10d4,local_10d8);
      uStack_1100 = CONCAT44(auVar10._12_4_,fStack_10d0);
      local_1320 = &local_1fe8;
      auVar1._8_8_ = uStack_1100;
      auVar1._0_8_ = local_1108;
      auVar10._0_8_ = auVar1._4_8_;
      auVar10._8_4_ = local_10d8;
      local_1318._8_8_ = auVar10._8_8_;
      local_12f8 = &local_1fe8;
      uStack_1300 = local_1318._8_8_;
      uStack_1fe0 = local_1318._8_8_;
      local_16d0 = &local_1fe8;
      uStack_1140 = local_1318._8_8_;
      local_1130 = &local_23b8;
      uStack_23b0 = local_1318._8_8_;
      local_1f30 = &local_2378;
      local_1f38 = &local_23b8;
      uStack_2370 = local_1318._8_8_;
      local_1f70 = &local_2398;
      local_1f68 = &local_2388;
      local_1318 = auVar10;
      local_1308 = auVar10._0_8_;
      local_12f0 = local_1328;
      local_12e8 = local_1770;
      local_12d8 = auVar9;
      local_12c8 = auVar9._0_8_;
      local_12b8 = local_12e0;
      local_12b0 = local_1770;
      local_12a8 = local_1750;
      local_1298 = auVar8;
      local_1288 = auVar8._0_8_;
      local_1278 = local_12a0;
      local_1270 = local_1750;
      local_1248 = local_12a0;
      local_1240 = local_1738;
      local_1238 = local_1328;
      local_1230 = local_12a0;
      local_1228 = local_1738;
      local_1208 = local_1220;
      local_1200 = local_12a0;
      local_11f8 = local_1738;
      local_11f0 = local_1790;
      local_11e8 = local_12e0;
      local_11e0 = local_1250;
      local_11c0 = local_1250;
      local_11b8 = local_1790;
      local_11b0 = local_12e0;
      local_1148 = auVar10._0_8_;
      local_10f0 = local_1250;
      local_10e8 = local_1220;
      local_10e0 = local_1328;
      fStack_10cc = auVar10._12_4_;
      local_10c0 = local_1328;
      local_10b8 = local_1250;
      local_10b0 = local_1220;
      local_1078 = auVar9._0_8_;
      local_1068 = auVar8._0_8_;
      local_23b8 = auVar10._0_8_;
      local_2378 = auVar10._0_8_;
      local_2008 = CONCAT44(fStack_11d4,local_11d8);
      uStack_2000 = CONCAT44(fStack_11cc,fStack_11d0);
      local_1ff8 = local_1108;
      uStack_1ff0 = uStack_1100;
      local_1fe8 = auVar10._0_8_;
      local_1fb8 = auVar9._0_8_;
      local_1f98 = auVar8._0_8_;
      local_1268 = local_1098;
      uStack_1260 = uStack_1090;
    }
    local_1f10 = &local_23d8;
    local_1e98 = &local_2368;
    local_1e9c = 0x3f000000;
    local_1e80 = &local_1eb8;
    local_1e84 = 0x3f000000;
    local_136c = 0x3f000000;
    local_1388 = 0x3f000000;
    uStack_1384 = 0x3f000000;
    uStack_1380 = 0x3f000000;
    uStack_137c = 0x3f000000;
    local_1eb8 = 0x3f0000003f000000;
    uStack_1eb0 = 0x3f0000003f000000;
    local_dc8 = 0x3f0000003f000000;
    uStack_dc0 = 0x3f0000003f000000;
    local_db8._0_4_ = (float)local_2368;
    local_db8._4_4_ = (float)((ulong)local_2368 >> 0x20);
    uStack_db0._0_4_ = (float)uStack_2360;
    uStack_db0._4_4_ = (float)((ulong)uStack_2360 >> 0x20);
    local_de8 = (float)local_db8 * 0.5;
    fStack_de4 = local_db8._4_4_ * 0.5;
    fStack_de0 = (float)uStack_db0 * 0.5;
    fStack_ddc = uStack_db0._4_4_ * 0.5;
    local_1028 = CONCAT44(fStack_de4,local_de8);
    uStack_1020 = CONCAT44(fStack_ddc,fStack_de0);
    local_1f48 = &local_23c8;
    uVar12 = *in_RDI;
    uVar7 = in_RDI[1];
    local_1018._0_4_ = (float)uVar12;
    local_1018._4_4_ = (float)(uVar12 >> 0x20);
    uStack_1010._0_4_ = (float)uVar7;
    uStack_1010._4_4_ = (float)(uVar7 >> 0x20);
    local_1188 = (float)local_1018 + local_de8;
    fStack_1184 = local_1018._4_4_ + fStack_de4;
    fStack_1180 = (float)uStack_1010 + fStack_de0;
    fStack_117c = uStack_1010._4_4_ + fStack_ddc;
    local_23c8 = CONCAT44(fStack_1184,local_1188);
    uStack_23c0 = CONCAT44(fStack_117c,fStack_1180);
    *in_RDI = local_23c8;
    in_RDI[1] = uStack_23c0;
    local_20a8 = &local_23f8;
    local_20ac = 0xbf800000;
    local_20b0 = 0xbf800000;
    local_20b4 = 0xbf800000;
    local_1cdc = 0;
    local_1ce0 = 0xbf800000;
    local_1ce4 = 0xbf800000;
    local_1ce8 = 0xbf800000;
    local_1cf8 = 0xbf800000bf800000;
    uStack_1cf0 = 0xbf800000;
    local_23f8 = 0xbf800000bf800000;
    uStack_23f0 = 0xbf800000;
    local_1e20 = &local_23e8;
    local_f10 = &local_1d58;
    local_ed8 = 0xbf800000bf800000;
    uStack_ed0 = 0xbf800000;
    local_ee8 = 0xbf800000bf800000;
    uStack_ee0 = 0xbf800000;
    local_f08 = 0x3f800000;
    uStack_f04 = 0x3f800000;
    uStack_f00 = 0x3f800000;
    uStack_efc = 0;
    local_618 = 0x3f8000003f800000;
    uStack_610 = 0x3f800000;
    local_608 = &local_638;
    local_5d8 = &local_648;
    local_4c8 = 0x3f8000003f800000;
    uStack_4c0 = 0x3f8000003f800000;
    local_5a8 = &local_658;
    local_538 = 0x3f8000003f800000;
    uStack_530 = 0x3f8000003f800000;
    local_578 = &local_678;
    local_4f8 = 0x40000000;
    uStack_4f4 = 0x40000000;
    uStack_4f0 = 0x40000000;
    uStack_4ec = 0x3f800000;
    local_528 = 0x4000000040000000;
    uStack_520 = 0x3f80000040000000;
    local_600 = &local_668;
    local_d0c = 0x40400000;
    uStack_564 = 0x40400000;
    uStack_560 = 0x40400000;
    uStack_55c = 0x40000000;
    local_5f8 = 0x4040000040400000;
    uStack_5f0 = 0x4000000040400000;
    local_b88 = ZEXT416(0x40400000);
    local_d28 = 0x40400000;
    uStack_d20 = 0;
    local_b48 = 0x40400000;
    uStack_b40 = 0;
    local_d38 = rsqrtss(ZEXT816(0x40400000),ZEXT816(0x40400000));
    local_b8c = 0x3fc00000;
    local_ba8 = ZEXT416(0x3fc00000);
    local_918 = local_d38._0_8_;
    uVar4 = local_918;
    uStack_910 = local_d38._8_8_;
    local_918._0_4_ = local_d38._0_4_;
    local_908 = (ulong)(uint)((float)local_918 * 1.5);
    uStack_900 = 0;
    local_bac = 0xbf000000;
    local_bc8 = ZEXT416(0xbf000000);
    local_938 = local_bc8._0_8_;
    uStack_930 = 0;
    local_928 = 0xbfc00000;
    uStack_920 = 0;
    local_958 = local_d38._0_8_;
    uStack_950 = local_d38._8_8_;
    local_948 = (ulong)(uint)((float)local_918 * -1.5);
    uStack_940 = 0;
    local_978 = local_d38._0_8_;
    uStack_970 = local_d38._8_8_;
    local_968 = CONCAT44(local_d38._4_4_,(float)local_918 * (float)local_918);
    uStack_960 = local_d38._8_8_;
    local_998 = local_968;
    uStack_990 = local_d38._8_8_;
    local_1e04 = (float)local_918 * -1.5 * (float)local_918 * (float)local_918;
    local_988 = (ulong)(uint)local_1e04;
    uStack_980 = 0;
    local_af8 = local_988;
    uStack_af0 = 0;
    local_1e04 = (float)local_918 * 1.5 + local_1e04;
    local_ae8 = (ulong)(uint)local_1e04;
    uStack_ae0 = 0;
    local_d48 = local_ae8;
    uStack_d40 = 0;
    local_8d8 = local_ae8;
    uStack_8d0 = 0;
    local_1de8 = &local_1e18;
    local_e88 = CONCAT44(local_1e04,local_1e04);
    uStack_e80 = CONCAT44(local_1e04,local_1e04);
    local_e78 = 0xbf800000bf800000;
    uStack_e70 = 0xbf800000;
    local_ea8 = local_1e04 * -1.0;
    fStack_ea4 = local_1e04 * -1.0;
    fStack_ea0 = local_1e04 * -1.0;
    fStack_e9c = local_1e04 * 0.0;
    uStack_7a0 = CONCAT44(fStack_e9c,fStack_ea0);
    local_1db8 = &local_22e8;
    local_1de0 = &local_2488;
    local_1dac = local_22d8;
    local_8a8 = local_1dc8;
    local_854 = local_22d8;
    local_82c = local_22d8;
    local_848 = local_22d8;
    fStack_844 = local_22d8;
    fStack_840 = local_22d8;
    fStack_83c = local_22d8;
    local_898._0_4_ = (float)local_22e8;
    local_898._4_4_ = (float)((ulong)local_22e8 >> 0x20);
    uStack_890._0_4_ = (float)uStack_22e0;
    uStack_890._4_4_ = (float)(uStack_22e0 >> 0x20);
    local_878 = local_22d8 * (float)local_898;
    fStack_874 = local_22d8 * local_898._4_4_;
    fStack_870 = local_22d8 * (float)uStack_890;
    fStack_86c = local_22d8 * uStack_890._4_4_;
    local_1048 = CONCAT44(fStack_874,local_878);
    uStack_1040 = CONCAT44(fStack_86c,fStack_870);
    local_1dd0 = &local_2478;
    local_1dd8 = &local_22f8;
    local_1038._0_4_ = (float)local_22f8;
    local_1038._4_4_ = (float)((ulong)local_22f8 >> 0x20);
    uStack_1030._0_4_ = (float)uStack_22f0;
    uStack_1030._4_4_ = (float)(uStack_22f0 >> 0x20);
    local_8c8 = (float)local_1038 + local_878;
    fStack_8c4 = local_1038._4_4_ + fStack_874;
    fStack_8c0 = (float)uStack_1030 + fStack_870;
    fStack_8bc = uStack_1030._4_4_ + fStack_86c;
    local_11a8 = CONCAT44(fStack_8c4,local_8c8);
    uStack_11a0 = CONCAT44(fStack_8bc,fStack_8c0);
    local_7dc = 0x80000000;
    local_7bc = 0x80000000;
    local_7c0 = 0x80000000;
    local_7c4 = 0x80000000;
    local_7c8 = 0x80000000;
    local_828 = 0x8000000080000000;
    uStack_820 = 0x8000000080000000;
    local_7f8 = -local_ea8;
    fStack_7f4 = -fStack_ea4;
    uStack_7f0 = uStack_7a0 ^ 0x8000000080000000;
    local_2260 = &inf;
    local_1f00 = local_1f48;
    local_1e90 = local_1f10;
    local_1e28 = local_20a8;
    local_1e00 = local_20a8;
    local_1df8 = local_1e20;
    local_1dec = local_1e04;
    local_1da8 = local_1de0;
    local_1da0 = local_1dd0;
    local_1d98 = &local_2468;
    local_1d90 = local_1e20;
    local_1d88 = local_2498;
    local_1d48 = local_20a8;
    local_1d40 = local_20a8;
    local_13c8 = local_1e04;
    fStack_13c4 = local_1e04;
    fStack_13c0 = local_1e04;
    fStack_13bc = local_1e04;
    local_13ac = local_1e04;
    local_1190 = &local_2468;
    local_1170 = local_1f48;
    local_1038 = local_22f8;
    uStack_1030 = uStack_22f0;
    local_1018 = uVar12;
    uStack_1010 = uVar7;
    local_f20 = local_20a8;
    local_f18 = local_20a8;
    local_ef0 = local_f10;
    local_ec0 = local_1de8;
    local_eb8 = local_20a8;
    local_eb0 = local_1e20;
    local_e90 = local_1e20;
    local_e00 = local_1e80;
    local_df8 = local_1e98;
    local_df0 = local_1f10;
    local_dd0 = local_1f10;
    local_db8 = local_2368;
    uStack_db0 = uStack_2360;
    local_b6c = local_d0c;
    local_918 = uVar4;
    local_8b8 = local_1dd0;
    local_8b0 = local_1db8;
    local_8a0 = local_1de0;
    local_898 = local_22e8;
    uStack_890 = uStack_22e0;
    local_860 = local_1de0;
    local_850 = local_8a8;
    local_818 = local_1e20;
    local_810 = local_2498;
    local_808 = local_828;
    uStack_800 = uStack_820;
    local_7e8 = local_2498;
    local_7d8 = local_828;
    uStack_7d0 = uStack_820;
    local_7b8 = local_828;
    uStack_7b0 = uStack_820;
    local_620 = local_f10;
    local_5e0 = local_608;
    local_5b0 = local_608;
    local_580 = local_5a8;
    local_570 = local_600;
    local_568 = local_d0c;
    local_550 = local_600;
    local_548 = local_5a8;
    local_540 = local_578;
    local_510 = local_5d8;
    local_508 = local_608;
    local_500 = local_578;
    local_4e0 = local_578;
    local_4d8 = local_5d8;
    local_4d0 = local_608;
    local_4b8 = local_618;
    uStack_4b0 = uStack_610;
    local_248 = local_608;
    local_240 = local_5d8;
    local_238 = uStack_f04;
    uStack_234 = uStack_f04;
    uStack_230 = uStack_f04;
    uStack_22c = uStack_f04;
    local_228 = local_4c8;
    uStack_220 = uStack_4c0;
    local_218 = local_5d8;
    local_210 = local_608;
    local_208 = local_618;
    uStack_200 = uStack_610;
    local_158 = local_608;
    local_150 = local_5a8;
    local_148 = uStack_f00;
    uStack_144 = uStack_f00;
    uStack_140 = uStack_f00;
    uStack_13c = uStack_f00;
    local_138 = local_538;
    uStack_130 = uStack_530;
    local_128 = local_5a8;
    local_120 = local_608;
    local_118 = local_618;
    uStack_110 = uStack_610;
    uStack_2490 = uStack_7f0;
    local_2488 = local_1048;
    uStack_2480 = uStack_1040;
    local_2478 = local_11a8;
    uStack_2470 = uStack_11a0;
    local_2468 = local_11a8;
    uStack_2460 = uStack_11a0;
    uStack_23e0 = uStack_7a0;
    local_23d8 = local_1028;
    uStack_23d0 = uStack_1020;
    local_1e18 = local_e88;
    uStack_1e10 = uStack_e80;
    local_1d58 = local_618;
    uStack_1d50 = uStack_610;
    local_678 = local_528;
    uStack_670 = uStack_520;
    local_668 = local_5f8;
    uStack_660 = uStack_5f0;
    local_658 = local_538;
    uStack_650 = uStack_530;
    local_648 = local_4c8;
    uStack_640 = uStack_4c0;
    local_638 = local_618;
    uStack_630 = uStack_610;
    local_23e8 = local_ea8;
    fStack_23e4 = fStack_ea4;
    local_7a8 = local_ea8;
    fStack_7a4 = fStack_ea4;
    local_2438 = std::numeric_limits<float>::infinity();
    local_2110 = &local_2458;
    local_2124 = 0x3a83126f;
    local_212c = 0;
    local_2130 = 0xffffffff;
    local_2134 = 0xffffffff;
    local_2138 = 0xffffffff;
    local_1b6c = 0x3a83126f;
    local_1a28 = &local_1b88;
    local_1a2c = 0xffffffff;
    local_1a30 = 0xffffffff;
    local_1a34 = 0xffffffff;
    local_1a38 = 0;
    local_168c = 0;
    local_1690 = 0xffffffff;
    local_1694 = 0xffffffff;
    local_1698 = 0xffffffff;
    local_16a8 = 0xffffffffffffffff;
    uStack_16a0 = 0xffffffff;
    local_1b88 = 0xffffffffffffffff;
    uStack_1b80 = 0xffffffff;
    local_1968 = 0xffffffffffffffff;
    uStack_1960 = 0xffffffff;
    local_19b8 = &local_1ba8;
    local_1ba8 = 0xffffffffffffffff;
    uStack_1ba0 = 0xffffffff;
    local_1888 = local_2468;
    uStack_17e0 = uStack_2460;
    local_19c0 = &local_1bb8;
    local_19c8 = &local_1bc8;
    local_170c = 0x3a83126f;
    local_140c = 0x3a83126f;
    local_1428 = 0x3a83126f;
    uStack_1424 = 0x3a83126f;
    uStack_1420 = 0x3a83126f;
    uStack_141c = 0x3a83126f;
    local_14a8 = 0x3a83126f3a83126f;
    uStack_14a0 = 0x3a83126f3a83126f;
    local_19b0 = &local_1b98;
    local_1598 = 0xffffffffffffffff;
    uStack_1590 = 0xffffffff;
    uStack_1610 = uStack_2460 & 0xffffffff;
    local_1498 = 0xffffffffffffffff;
    uStack_1490 = 0xffffffff;
    local_1628 = 0;
    uStack_1620 = 0x3a83126f00000000;
    uStack_1880 = uStack_1610 | 0x3a83126f00000000;
    local_1bd0 = local_2448;
    local_1bdc = 0;
    local_1a10 = &local_1bf8;
    local_1a14 = 0xffffffff;
    local_1a18 = 0xffffffff;
    local_1a1c = 0xffffffff;
    local_1a20 = 0;
    local_16ac = 0;
    local_16b0 = 0xffffffff;
    local_16b4 = 0xffffffff;
    local_16b8 = 0xffffffff;
    local_16c8 = 0xffffffffffffffff;
    uStack_16c0 = 0xffffffff;
    local_1bf8 = 0xffffffffffffffff;
    uStack_1bf0 = 0xffffffff;
    local_1958 = 0xffffffffffffffff;
    uStack_1950 = 0xffffffff;
    local_1998 = &local_1c18;
    local_1c18 = 0xffffffffffffffff;
    uStack_1c10 = 0xffffffff;
    uStack_17c0 = uStack_2490;
    local_19a0 = local_1c28;
    local_19a8 = &local_1c38;
    local_16fc = 0;
    local_142c = 0;
    local_1448 = 0;
    uStack_1444 = 0;
    uStack_1440 = 0;
    uStack_143c = 0;
    local_14c8 = 0;
    uStack_14c0 = 0;
    local_1990 = local_1c08;
    local_15b8 = 0xffffffffffffffff;
    uStack_15b0 = 0xffffffff;
    uStack_18a0 = uStack_2490 & 0xffffffff;
    local_14b8 = 0xffffffffffffffff;
    uStack_14b0 = 0xffffffff;
    local_1648 = 0;
    uStack_1644 = 0;
    uStack_1640 = 0;
    uStack_163c = 0;
    local_1890 = local_1c08;
    local_16d8 = local_1c08;
    local_2434 = 0xffffffff;
    local_1a78 = auStack_2428;
    local_2414 = 0xffffffff;
    local_2410 = 0xffffffff;
    local_240c = 0xffffffff;
    local_2408 = 0xffffffff;
    local_1d80 = &local_2458;
    local_2128 = local_2438;
    local_2120 = local_2498;
    local_2118 = &local_2468;
    local_1bd8 = local_2498;
    local_1b68 = &local_2468;
    local_1b60 = local_2110;
    local_1938 = local_1a28;
    local_1930 = local_1a10;
    local_18e8 = local_1968;
    uStack_18e0 = uStack_1960;
    local_18d0 = local_19b8;
    local_18c8 = local_1958;
    uStack_18c0 = uStack_1950;
    local_18b0 = local_1998;
    local_1870 = local_19b0;
    local_17e8 = local_1888;
    local_17d0 = local_19c0;
    local_17b0 = local_19a0;
    local_1708 = local_19c8;
    local_16f8 = local_19a8;
    local_16e0 = local_19b0;
    uStack_1630 = uStack_18a0;
    local_1618 = local_1888;
    uStack_15c0 = uStack_17c0;
    local_15a8 = local_1888;
    uStack_15a0 = uStack_17e0;
    local_1548 = local_1998;
    local_1540 = local_1998;
    local_1538 = local_19b8;
    local_1530 = local_19b8;
    local_1508 = local_19a8;
    local_1500 = local_19a0;
    local_14f8 = local_19c8;
    local_14f0 = local_19c0;
    local_2458 = local_1888;
    uStack_2450 = uStack_1880;
    uStack_2440 = uStack_18a0;
    local_1c38 = local_14c8;
    uStack_1c30 = uStack_14c0;
    uStack_1c20 = uStack_17c0;
    uStack_1c00 = uStack_18a0;
    local_1bc8 = local_14a8;
    uStack_1bc0 = uStack_14a0;
    local_1bb8 = local_1888;
    uStack_1bb0 = uStack_17e0;
    local_1b98 = local_1888;
    uStack_1b90 = uStack_1880;
    rtcOccluded1(g_scene,local_1d80,0);
    *local_2290 = *local_2290 + 1;
    uVar7 = (ulong)(uint)local_2438;
    uVar12 = 0;
    if (0.0 <= local_2438) {
      local_f38 = (float)local_2378;
      fStack_f34 = (float)((ulong)local_2378 >> 0x20);
      fStack_f30 = (float)uStack_2370;
      fVar5 = local_f38 * local_f38 + fStack_f34 * fStack_f34 + fStack_f30 * fStack_f30;
      auVar11 = rsqrtss(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
      local_9b8 = auVar11._0_4_;
      fVar5 = local_9b8 * 1.5 + fVar5 * -0.5 * local_9b8 * local_9b8 * local_9b8;
      fStack_f90 = (float)uStack_23e0;
      fVar5 = -(local_23e8 * local_f38 * fVar5 + fStack_23e4 * fStack_f34 * fVar5 +
               fStack_f90 * fStack_f30 * fVar5);
      local_2534 = 1.0;
      if (fVar5 < 1.0) {
        local_2534 = fVar5;
      }
      local_2538 = 0.0;
      if (0.0 <= local_2534) {
        local_2538 = local_2534;
      }
      local_d58 = (float)local_2368;
      fStack_d54 = (float)((ulong)local_2368 >> 0x20);
      fStack_d50 = (float)uStack_2360;
      fStack_d4c = (float)((ulong)uStack_2360 >> 0x20);
      uVar12 = *in_RDI;
      local_ff8 = (float)uVar12;
      fStack_ff4 = (float)(uVar12 >> 0x20);
      fStack_ff0 = (float)in_RDI[1];
      fStack_fec = (float)(in_RDI[1] >> 0x20);
      uVar7 = CONCAT44(fStack_ff4 + fStack_d54 * local_2538,local_ff8 + local_d58 * local_2538);
      *in_RDI = uVar7;
      in_RDI[1] = CONCAT44(fStack_fec + fStack_d4c * local_2538,fStack_ff0 + fStack_d50 * local_2538
                          );
    }
  }
  VVar13.field_0._8_8_ = uVar12;
  VVar13.field_0._0_8_ = uVar7;
  return (Vec3fa)VVar13.field_0;
}

Assistant:

Vec3fa renderPixelStandard(float x, float y, const ISPCCamera& camera, RayStats& stats)
{
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  /* intersect ray with scene */
  rtcIntersect1(g_scene,RTCRayHit_(ray));
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    Vec3fa diffuse = ray.geomID != 0 ? Vec3fa(0.9f,0.6f,0.5f) : Vec3fa(0.8f,0.0f,0.0f);

    Vec3fa Ng = ray.Ng;
    if (ray.geomID > 0) {
      Vec3fa dPdu,dPdv;
      auto geomID = ray.geomID; {
        rtcInterpolate1(rtcGetGeometry(g_scene,geomID),ray.primID,ray.u,ray.v,RTC_BUFFER_TYPE_VERTEX,0,nullptr,&dPdu.x,&dPdv.x,3);
      }
      Ng = cross(dPdu,dPdv);
    }

    color = color + diffuse*0.5f;
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));

    /* initialize shadow ray */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(lightDir), 0.001f, inf);

    /* trace shadow ray */
    rtcOccluded1(g_scene,RTCRay_(shadow));
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f)
      color = color + diffuse*clamp(-dot(lightDir,normalize(Ng)),0.0f,1.0f);
  }
  return color;
}